

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

pageant_pubkey * find_key(char *string,char **retstr)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  uint i;
  int iVar4;
  int iVar5;
  uint type;
  pageant_pubkey *filename;
  pageant_pubkey *ppVar6;
  long lVar7;
  char *pcVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  long lVar11;
  byte bVar12;
  key_find_ctx ctx [1];
  pageant_pubkey key_in;
  char *local_68;
  undefined1 local_60;
  undefined1 local_5f;
  byte abStack_5e [6];
  pageant_pubkey *local_58;
  int local_50;
  pageant_pubkey local_48;
  
  iVar4 = strncmp(string,"file:",5);
  if (iVar4 == 0) {
    string = string + 5;
    bVar1 = true;
    uVar9 = 0;
LAB_0010ad2f:
    uVar10 = 0;
LAB_0010ad31:
    lVar11 = 1;
    bVar12 = 1;
  }
  else {
    iVar5 = strncmp(string,"comment:",8);
    if (iVar5 == 0) {
      string = string + 8;
      uVar10 = 1;
      bVar1 = false;
      uVar9 = 0;
      goto LAB_0010ad31;
    }
    iVar5 = strncmp(string,"fp:",3);
    if (iVar5 == 0) {
      string = string + 3;
LAB_0010ad26:
      uVar9 = 1;
      bVar1 = false;
      goto LAB_0010ad2f;
    }
    iVar5 = strncmp(string,"fingerprint:",0xc);
    if (iVar5 == 0) {
      string = string + 0xc;
      goto LAB_0010ad26;
    }
    iVar5 = strncasecmp(string,"md5:",4);
    if (iVar5 == 0) {
      string = string + 4;
      uVar9 = 1;
      bVar1 = false;
      uVar10 = 0;
      bVar12 = 0;
      lVar11 = 0;
    }
    else {
      iVar5 = strncmp(string,"sha256:",7);
      lVar11 = 1;
      uVar9 = 1;
      if (iVar5 != 0) {
        bVar1 = true;
        uVar10 = 1;
        goto LAB_0010ad31;
      }
      string = string + 7;
      bVar1 = false;
      uVar10 = 0;
      bVar12 = 0;
    }
  }
  if (!bVar1) goto LAB_0010ae79;
  filename = (pageant_pubkey *)filename_from_str(string);
  type = key_type((Filename *)filename);
  ppVar6 = filename;
  if (type < 0xb) {
    if ((0x608U >> (type & 0x1f) & 1) == 0) {
      if ((0x104U >> (type & 0x1f) & 1) == 0) goto LAB_0010ae1e;
      local_48.blob = strbuf_new();
      iVar5 = rsa1_loadpub_f((Filename *)filename,(local_48.blob)->binarysink_,(char **)0x0,
                             &local_68);
      if (iVar5 != 0) {
        local_48.ssh_version = 1;
        goto LAB_0010adde;
      }
LAB_0010ae03:
      strbuf_free(local_48.blob);
      local_48.blob = (strbuf *)0x0;
      if (iVar4 == 0) {
        ppVar6 = (pageant_pubkey *)0x0;
        pcVar8 = dupprintf("unable to load file \'%s\': %s",string,local_68);
        *retstr = pcVar8;
        goto LAB_0010ae48;
      }
      bVar2 = true;
    }
    else {
      local_48.blob = strbuf_new();
      _Var3 = ppk_loadpub_f((Filename *)filename,(char **)0x0,(local_48.blob)->binarysink_,
                            (char **)0x0,&local_68);
      if (!_Var3) goto LAB_0010ae03;
      local_48.ssh_version = 2;
LAB_0010adde:
      local_48.comment = (char *)0x0;
      ppVar6 = pageant_pubkey_copy(&local_48);
      strbuf_free(local_48.blob);
      local_48.blob = (strbuf *)0x0;
LAB_0010ae48:
      filename_free((Filename *)filename);
      bVar2 = false;
    }
    bVar1 = true;
    if (bVar2) goto LAB_0010ae5b;
    bVar1 = false;
  }
  else {
LAB_0010ae1e:
    if (iVar4 == 0) {
      pcVar8 = key_type_to_str(type);
      ppVar6 = (pageant_pubkey *)0x0;
      pcVar8 = dupprintf("unable to load key file \'%s\': %s",string,pcVar8);
      *retstr = pcVar8;
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
LAB_0010ae5b:
    filename_free((Filename *)filename);
  }
  if (!bVar1) {
    return ppVar6;
  }
LAB_0010ae79:
  lVar7 = 0;
  do {
    abStack_5e[lVar7] = lVar11 == lVar7 | bVar12;
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  local_58 = (pageant_pubkey *)0x0;
  local_50 = 0;
  local_68 = string;
  local_60 = uVar9;
  local_5f = uVar10;
  iVar4 = pageant_enum_keys(key_find_callback,&local_68,retstr);
  if (iVar4 != 1) {
    if (local_50 == 0) {
      pcVar8 = dupstr("no key matched");
      *retstr = pcVar8;
      if (local_58 != (pageant_pubkey *)0x0) {
        __assert_fail("!ctx->found",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                      ,0x32b,"struct pageant_pubkey *find_key(const char *, char **)");
      }
    }
    else {
      if (local_50 < 2) {
        if (local_58 != (pageant_pubkey *)0x0) {
          return local_58;
        }
        __assert_fail("ctx->found",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                      ,0x334,"struct pageant_pubkey *find_key(const char *, char **)");
      }
      pcVar8 = dupstr("multiple keys matched");
      *retstr = pcVar8;
      if (local_58 == (pageant_pubkey *)0x0) {
        __assert_fail("ctx->found",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                      ,0x32f,"struct pageant_pubkey *find_key(const char *, char **)");
      }
      pageant_pubkey_free(local_58);
    }
  }
  return (pageant_pubkey *)0x0;
}

Assistant:

struct pageant_pubkey *find_key(const char *string, char **retstr)
{
    struct key_find_ctx ctx[1];
    struct pageant_pubkey key_in, *key_ret;
    bool try_file = true, try_fp = true, try_comment = true;
    bool file_errors = false;
    bool try_all_fptypes = true;
    FingerprintType fptype = SSH_FPTYPE_DEFAULT;

    /*
     * Trim off disambiguating prefixes telling us how to interpret
     * the provided string.
     */
    if (!strncmp(string, "file:", 5)) {
        string += 5;
        try_fp = false;
        try_comment = false;
        file_errors = true; /* also report failure to load the file */
    } else if (!strncmp(string, "comment:", 8)) {
        string += 8;
        try_file = false;
        try_fp = false;
    } else if (!strncmp(string, "fp:", 3)) {
        string += 3;
        try_file = false;
        try_comment = false;
    } else if (!strncmp(string, "fingerprint:", 12)) {
        string += 12;
        try_file = false;
        try_comment = false;
    } else if (!strnicmp(string, "md5:", 4)) {
        string += 4;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_MD5;
    } else if (!strncmp(string, "sha256:", 7)) {
        string += 7;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_SHA256;
    }

    /*
     * Try interpreting the string as a key file name.
     */
    if (try_file) {
        Filename *fn = filename_from_str(string);
        int keytype = key_type(fn);
        if (keytype == SSH_KEYTYPE_SSH1 ||
            keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!rsa1_loadpub_f(fn, BinarySink_UPCAST(key_in.blob),
                                NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 1;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else if (keytype == SSH_KEYTYPE_SSH2 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!ppk_loadpub_f(fn, NULL, BinarySink_UPCAST(key_in.blob),
                               NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 2;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else {
            if (file_errors) {
                *retstr = dupprintf("unable to load key file '%s': %s",
                                    string, key_type_to_str(keytype));
                filename_free(fn);
                return NULL;
            }
        }
        filename_free(fn);
    }

    /*
     * Failing that, go through the keys in the agent, and match
     * against fingerprints and comments as appropriate.
     */
    ctx->string = string;
    ctx->match_fp = try_fp;
    ctx->match_comment = try_comment;
    for (unsigned i = 0; i < SSH_N_FPTYPES; i++)
        ctx->match_fptypes[i] = (try_all_fptypes || i == fptype);
    ctx->found = NULL;
    ctx->nfound = 0;
    if (pageant_enum_keys(key_find_callback, ctx, retstr) ==
        PAGEANT_ACTION_FAILURE)
        return NULL;

    if (ctx->nfound == 0) {
        *retstr = dupstr("no key matched");
        assert(!ctx->found);
        return NULL;
    } else if (ctx->nfound > 1) {
        *retstr = dupstr("multiple keys matched");
        assert(ctx->found);
        pageant_pubkey_free(ctx->found);
        return NULL;
    }

    assert(ctx->found);
    return ctx->found;
}